

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O2

EStatusCode __thiscall
OpenTypePrimitiveReader::ReadLongDateTime(OpenTypePrimitiveReader *this,longlong *outValue)

{
  EStatusCode EVar1;
  EStatusCode EVar2;
  Byte byte8;
  Byte byte7;
  Byte byte6;
  Byte byte5;
  Byte byte4;
  Byte byte3;
  Byte byte2;
  Byte byte1;
  
  EVar1 = ReadBYTE(this,&byte1);
  EVar2 = eFailure;
  if (EVar1 == eSuccess) {
    EVar1 = ReadBYTE(this,&byte2);
    if (EVar1 == eSuccess) {
      EVar1 = ReadBYTE(this,&byte3);
      if (EVar1 == eSuccess) {
        EVar1 = ReadBYTE(this,&byte4);
        if (EVar1 == eSuccess) {
          EVar1 = ReadBYTE(this,&byte5);
          if (EVar1 == eSuccess) {
            EVar1 = ReadBYTE(this,&byte6);
            if (EVar1 == eSuccess) {
              EVar1 = ReadBYTE(this,&byte7);
              if (EVar1 == eSuccess) {
                EVar1 = ReadBYTE(this,&byte8);
                if (EVar1 == eSuccess) {
                  *outValue = (ulong)byte8 +
                              ((ulong)byte7 << 8 |
                              (ulong)byte6 << 0x10 |
                              (ulong)byte5 << 0x18 |
                              (ulong)byte4 << 0x20 |
                              (ulong)byte3 << 0x28 | (ulong)byte2 << 0x30 | (ulong)byte1 << 0x38);
                  EVar2 = eSuccess;
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::ReadLongDateTime(long long& outValue)
{
	Byte byte1,byte2,byte3,byte4,byte5,byte6,byte7,byte8;

	if(ReadBYTE(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte3) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte4) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte5) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte6) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte7) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte8) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue =(long long)(	((unsigned long long)byte1 << 56) + ((unsigned long long)byte2 << 48) + 
							((unsigned long long)byte3 << 40) + ((unsigned long long)byte4 << 32) + 
							((unsigned long long)byte5 << 24) + ((unsigned long long)byte6 << 16) + 
							((unsigned long long)byte7 << 8) + byte8);
	return PDFHummus::eSuccess;	
}